

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

int __thiscall GdlGlyphClassDefn::ActualForPseudo(GdlGlyphClassDefn *this,utf16 wPseudo)

{
  uint uVar1;
  size_type_conflict sVar2;
  reference ppGVar3;
  undefined8 extraout_RDX;
  ushort in_SI;
  long in_RDI;
  utf16 wActual;
  size_t ipglfd;
  ulong local_20;
  
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>::size
                      ((vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_> *)
                       (in_RDI + 0x58));
    if (sVar2 <= local_20) {
      return 0;
    }
    ppGVar3 = std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>::operator[]
                        ((vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_> *)
                         (in_RDI + 0x58),local_20);
    uVar1 = (*((*ppGVar3)->super_GdlDefn)._vptr_GdlDefn[4])
                      (*ppGVar3,(ulong)in_SI,extraout_RDX,CONCAT62((int6)(sVar2 >> 0x10),in_SI));
    if ((short)uVar1 != 0) break;
    local_20 = local_20 + 1;
  }
  return uVar1 & 0xffff;
}

Assistant:

int GdlGlyphClassDefn::ActualForPseudo(utf16 wPseudo)
{
	for (size_t ipglfd = 0; ipglfd < m_vpglfdMembers.size(); ipglfd++)
	{
		utf16 wActual = m_vpglfdMembers[ipglfd]->ActualForPseudo(wPseudo);
		if (wActual != 0)
			return wActual;
	}
	return 0;
}